

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelMessageName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  size_t *psVar1;
  char *pcVar2;
  char *in_R8;
  string_view filename;
  string_view separator;
  string local_e8;
  undefined1 local_c8 [80];
  AlphaNum local_78;
  AlphaNum local_48;
  
  separator._M_str = in_R8;
  separator._M_len = (size_t)".";
  pcVar2 = ".";
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,(python *)descriptor,(Descriptor *)0x1,separator);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    psVar1 = *(size_t **)(*(FileDescriptor **)(descriptor + 0x10) + 8);
    filename._M_str = pcVar2;
    filename._M_len = *psVar1;
    (anonymous_namespace)::ModuleAlias_abi_cxx11_(&local_e8,(void *)psVar1[1],filename);
    local_48.piece_._M_len = local_e8._M_string_length;
    local_48.piece_._M_str = local_e8._M_dataplus._M_p;
    local_78.piece_ = absl::lts_20240722::NullSafeStringView(".");
    local_c8._40_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_c8._32_8_ = __return_storage_ptr__->_M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c8,&local_48,&local_78);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelMessageName(
    const Descriptor& descriptor) const {
  std::string name = NamePrefixedWithNestedTypes(descriptor, ".");
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}